

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi__uint32 sVar5;
  stbi__context *in_RCX;
  _func_int_void_ptr_char_ptr_int *in_RDX;
  _func_void_void_ptr_int *in_RSI;
  stbi__context *in_RDI;
  char t;
  char p;
  char c;
  int dummy;
  int maxv;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  stbi__uint32 in_stack_ffffffffffffffd0;
  stbi__uint32 in_stack_ffffffffffffffd4;
  _func_int_void_ptr_char_ptr_int *local_20;
  _func_void_void_ptr_int *local_18;
  int local_4;
  
  local_18 = in_RSI;
  if (in_RSI == (_func_void_void_ptr_int *)0x0) {
    local_18 = (_func_void_void_ptr_int *)&stack0xffffffffffffffd0;
  }
  local_20 = in_RDX;
  if (in_RDX == (_func_int_void_ptr_char_ptr_int *)0x0) {
    local_20 = (_func_int_void_ptr_char_ptr_int *)&stack0xffffffffffffffd0;
  }
  if (in_RCX == (stbi__context *)0x0) {
    in_RCX = (stbi__context *)&stack0xffffffffffffffd0;
  }
  stbi__rewind(in_RDI);
  sVar1 = stbi__get8((stbi__context *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(in_stack_ffffffffffffffce,
                                       CONCAT15(in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8)
                                      )));
  sVar2 = stbi__get8((stbi__context *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(sVar1,CONCAT15(in_stack_ffffffffffffffcd,
                                                      in_stack_ffffffffffffffc8))));
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    sVar5 = 1;
    if (sVar2 == '6') {
      sVar5 = 3;
    }
    in_RCX->img_x = sVar5;
    sVar3 = stbi__get8((stbi__context *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(0x50,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    stbi__pnm_skip_whitespace
              ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    iVar4 = stbi__pnm_getinteger
                      (in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    *(int *)local_18 = iVar4;
    if (*(int *)local_18 == 0) {
      local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      stbi__pnm_skip_whitespace
                ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
      iVar4 = stbi__pnm_getinteger
                        (in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ));
      *(int *)local_20 = iVar4;
      if (*(int *)local_20 == 0) {
        local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        stbi__pnm_skip_whitespace
                  ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8)))
                  );
        iVar4 = stbi__pnm_getinteger
                          (in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0));
        if (iVar4 < 0x10000) {
          if (iVar4 < 0x100) {
            local_4 = 8;
          }
          else {
            local_4 = 0x10;
          }
        }
        else {
          local_4 = stbi__err((char *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
        }
      }
    }
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   if(*x == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   if (*y == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value
   if (maxv > 65535)
      return stbi__err("max value > 65535", "PPM image supports only 8-bit and 16-bit images");
   else if (maxv > 255)
      return 16;
   else
      return 8;
}